

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1514.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  WriteThis pooh;
  int res;
  CURLcode result;
  CURL *curl;
  char *URL_local;
  
  pooh.sizeleft._4_4_ = 0;
  pooh.sizeleft._0_4_ = 0;
  _ec_1 = data;
  pooh.readptr = (char *)0x5;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1514.c"
                  ,0x3e,iVar2,uVar3);
    pooh.sizeleft._0_4_ = iVar2;
  }
  if ((int)pooh.sizeleft == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1514.c"
                    ,0x40);
      pooh.sizeleft._0_4_ = 0x7c;
    }
    if ((int)pooh.sizeleft == 0) {
      iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1514.c"
                      ,0x42,iVar2,uVar3);
        pooh.sizeleft._0_4_ = iVar2;
      }
      if ((int)pooh.sizeleft == 0) {
        iVar2 = curl_easy_setopt(lVar4,0x2f,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1514.c"
                        ,0x43,iVar2,uVar3);
          pooh.sizeleft._0_4_ = iVar2;
        }
        if ((int)pooh.sizeleft == 0) {
          iVar2 = curl_easy_setopt(lVar4,0x4e2c,read_callback);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1514.c"
                          ,0x45,iVar2,uVar3);
            pooh.sizeleft._0_4_ = iVar2;
          }
          if ((int)pooh.sizeleft == 0) {
            iVar2 = curl_easy_setopt(lVar4,0x2719,&ec_1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1514.c"
                            ,0x46,iVar2,uVar3);
              pooh.sizeleft._0_4_ = iVar2;
            }
            if ((int)pooh.sizeleft == 0) {
              pooh.sizeleft._4_4_ = curl_easy_perform(lVar4);
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar4);
    curl_global_cleanup();
    URL_local._4_4_ = pooh.sizeleft._4_4_;
  }
  else {
    URL_local._4_4_ = (int)pooh.sizeleft;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode result = CURLE_OK;
  int res = 0;
  struct WriteThis pooh = { data, sizeof(data)-1 };

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_POST, 1L);
  /* Purposely omit to set CURLOPT_POSTFIELDSIZE */
  easy_setopt(curl, CURLOPT_READFUNCTION, read_callback);
  easy_setopt(curl, CURLOPT_READDATA, &pooh);

  result = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)result;
}